

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O0

DdNode * Cudd_zddIsop(DdManager *dd,DdNode *L,DdNode *U,DdNode **zdd_I)

{
  int iVar1;
  DdNode *pDVar2;
  int autoDynZ;
  DdNode *res;
  DdNode **zdd_I_local;
  DdNode *U_local;
  DdNode *L_local;
  DdManager *dd_local;
  
  iVar1 = dd->autoDynZ;
  dd->autoDynZ = 0;
  do {
    dd->reordered = 0;
    pDVar2 = cuddZddIsop(dd,L,U,zdd_I);
  } while (dd->reordered == 1);
  dd->autoDynZ = iVar1;
  return pDVar2;
}

Assistant:

DdNode  *
Cudd_zddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U,
  DdNode ** zdd_I)
{
    DdNode      *res;
    int         autoDynZ;

    autoDynZ = dd->autoDynZ;
    dd->autoDynZ = 0;

    do {
        dd->reordered = 0;
        res = cuddZddIsop(dd, L, U, zdd_I);
    } while (dd->reordered == 1);
    dd->autoDynZ = autoDynZ;
    return(res);

}